

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O0

void __thiscall BrokerSendMessage_TwoParts_Test::TestBody(BrokerSendMessage_TwoParts_Test *this)

{
  uint32_t uVar1;
  message_type x;
  message_type x_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> *pMVar5;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *pTVar6;
  czstring verb_00;
  czstring path_00;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  undefined8 uStackY_a08;
  undefined1 in_stack_fffffffffffff600 [248];
  undefined8 in_stack_fffffffffffff6f8;
  ReturnAction<bool> local_880;
  Action<bool_(const_pstore::brokerface::message_type_&)> local_870;
  WithoutMatchers local_849;
  undefined8 local_848 [32];
  EqMatcher<pstore::brokerface::message_type> local_748;
  Matcher<const_pstore::brokerface::message_type_&> local_648;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> local_630;
  ReturnAction<bool> local_610;
  Action<bool_(const_pstore::brokerface::message_type_&)> local_600;
  WithoutMatchers local_5d9;
  undefined8 local_5d8 [32];
  EqMatcher<pstore::brokerface::message_type> local_4d8;
  Matcher<const_pstore::brokerface::message_type_&> local_3d8;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> local_3c0;
  allocator local_399;
  string local_398;
  undefined1 local_374 [8];
  message_type expected2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  message_type expected1;
  mock_writer wr;
  size_t part2_chars;
  string local_78 [8];
  string path;
  size_type payload_length;
  size_t part1_chars;
  allocator local_31;
  undefined1 local_30 [8];
  string verb;
  BrokerSendMessage_TwoParts_Test *this_local;
  
  bVar9 = 0;
  verb.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"verb",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  lVar2 = std::__cxx11::string::length();
  uVar3 = -lVar2 + 0xf3;
  uVar4 = -lVar2 + 0xf4;
  path.field_2._8_8_ = uVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,uVar4,'p',(allocator *)((long)&part2_chars + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&part2_chars + 7));
  uVar4 = path.field_2._8_8_ - uVar3;
  anon_unknown.dwarf_382ab::mock_writer::mock_writer
            ((mock_writer *)(expected1.payload._M_elems + 0xec));
  uVar1 = (this->super_BrokerSendMessage).message_id_;
  std::operator+(&local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,' ');
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(expected2.payload._M_elems + 0xf0),uVar3,'p',
             (allocator *)(expected2.payload._M_elems + 0xef));
  std::operator+(&local_230,&local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (expected2.payload._M_elems + 0xf0));
  pstore::brokerface::message_type::message_type((message_type *)local_210,uVar1,0,2,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)(expected2.payload._M_elems + 0xf0));
  std::allocator<char>::~allocator((allocator<char> *)(expected2.payload._M_elems + 0xef));
  std::__cxx11::string::~string((string *)&local_250);
  uVar1 = (this->super_BrokerSendMessage).message_id_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,uVar4,'p',&local_399);
  pstore::brokerface::message_type::message_type((message_type *)local_374,uVar1,1,2,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  memcpy(local_5d8,local_210,0x100);
  puVar7 = local_5d8;
  puVar8 = &uStackY_a08;
  for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  x.payload._M_elems[0xec] = (char)in_stack_fffffffffffff6f8;
  x.payload._M_elems[0xed] = (char)((ulong)in_stack_fffffffffffff6f8 >> 8);
  x.payload._M_elems[0xee] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x10);
  x.payload._M_elems[0xef] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x18);
  x.payload._M_elems[0xf0] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  x.payload._M_elems[0xf1] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x28);
  x.payload._M_elems[0xf2] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x30);
  x.payload._M_elems[0xf3] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x38);
  x.sender_id = in_stack_fffffffffffff600._0_4_;
  x.message_id = in_stack_fffffffffffff600._4_4_;
  x.part_no = in_stack_fffffffffffff600._8_2_;
  x.num_parts = in_stack_fffffffffffff600._10_2_;
  x.payload._M_elems[0] = in_stack_fffffffffffff600[0xc];
  x.payload._M_elems[1] = in_stack_fffffffffffff600[0xd];
  x.payload._M_elems[2] = in_stack_fffffffffffff600[0xe];
  x.payload._M_elems[3] = in_stack_fffffffffffff600[0xf];
  x.payload._M_elems[4] = in_stack_fffffffffffff600[0x10];
  x.payload._M_elems[5] = in_stack_fffffffffffff600[0x11];
  x.payload._M_elems[6] = in_stack_fffffffffffff600[0x12];
  x.payload._M_elems[7] = in_stack_fffffffffffff600[0x13];
  x.payload._M_elems[8] = in_stack_fffffffffffff600[0x14];
  x.payload._M_elems[9] = in_stack_fffffffffffff600[0x15];
  x.payload._M_elems[10] = in_stack_fffffffffffff600[0x16];
  x.payload._M_elems[0xb] = in_stack_fffffffffffff600[0x17];
  x.payload._M_elems[0xc] = in_stack_fffffffffffff600[0x18];
  x.payload._M_elems[0xd] = in_stack_fffffffffffff600[0x19];
  x.payload._M_elems[0xe] = in_stack_fffffffffffff600[0x1a];
  x.payload._M_elems[0xf] = in_stack_fffffffffffff600[0x1b];
  x.payload._M_elems[0x10] = in_stack_fffffffffffff600[0x1c];
  x.payload._M_elems[0x11] = in_stack_fffffffffffff600[0x1d];
  x.payload._M_elems[0x12] = in_stack_fffffffffffff600[0x1e];
  x.payload._M_elems[0x13] = in_stack_fffffffffffff600[0x1f];
  x.payload._M_elems[0x14] = in_stack_fffffffffffff600[0x20];
  x.payload._M_elems[0x15] = in_stack_fffffffffffff600[0x21];
  x.payload._M_elems[0x16] = in_stack_fffffffffffff600[0x22];
  x.payload._M_elems[0x17] = in_stack_fffffffffffff600[0x23];
  x.payload._M_elems[0x18] = in_stack_fffffffffffff600[0x24];
  x.payload._M_elems[0x19] = in_stack_fffffffffffff600[0x25];
  x.payload._M_elems[0x1a] = in_stack_fffffffffffff600[0x26];
  x.payload._M_elems[0x1b] = in_stack_fffffffffffff600[0x27];
  x.payload._M_elems[0x1c] = in_stack_fffffffffffff600[0x28];
  x.payload._M_elems[0x1d] = in_stack_fffffffffffff600[0x29];
  x.payload._M_elems[0x1e] = in_stack_fffffffffffff600[0x2a];
  x.payload._M_elems[0x1f] = in_stack_fffffffffffff600[0x2b];
  x.payload._M_elems[0x20] = in_stack_fffffffffffff600[0x2c];
  x.payload._M_elems[0x21] = in_stack_fffffffffffff600[0x2d];
  x.payload._M_elems[0x22] = in_stack_fffffffffffff600[0x2e];
  x.payload._M_elems[0x23] = in_stack_fffffffffffff600[0x2f];
  x.payload._M_elems[0x24] = in_stack_fffffffffffff600[0x30];
  x.payload._M_elems[0x25] = in_stack_fffffffffffff600[0x31];
  x.payload._M_elems[0x26] = in_stack_fffffffffffff600[0x32];
  x.payload._M_elems[0x27] = in_stack_fffffffffffff600[0x33];
  x.payload._M_elems[0x28] = in_stack_fffffffffffff600[0x34];
  x.payload._M_elems[0x29] = in_stack_fffffffffffff600[0x35];
  x.payload._M_elems[0x2a] = in_stack_fffffffffffff600[0x36];
  x.payload._M_elems[0x2b] = in_stack_fffffffffffff600[0x37];
  x.payload._M_elems[0x2c] = in_stack_fffffffffffff600[0x38];
  x.payload._M_elems[0x2d] = in_stack_fffffffffffff600[0x39];
  x.payload._M_elems[0x2e] = in_stack_fffffffffffff600[0x3a];
  x.payload._M_elems[0x2f] = in_stack_fffffffffffff600[0x3b];
  x.payload._M_elems[0x30] = in_stack_fffffffffffff600[0x3c];
  x.payload._M_elems[0x31] = in_stack_fffffffffffff600[0x3d];
  x.payload._M_elems[0x32] = in_stack_fffffffffffff600[0x3e];
  x.payload._M_elems[0x33] = in_stack_fffffffffffff600[0x3f];
  x.payload._M_elems[0x34] = in_stack_fffffffffffff600[0x40];
  x.payload._M_elems[0x35] = in_stack_fffffffffffff600[0x41];
  x.payload._M_elems[0x36] = in_stack_fffffffffffff600[0x42];
  x.payload._M_elems[0x37] = in_stack_fffffffffffff600[0x43];
  x.payload._M_elems[0x38] = in_stack_fffffffffffff600[0x44];
  x.payload._M_elems[0x39] = in_stack_fffffffffffff600[0x45];
  x.payload._M_elems[0x3a] = in_stack_fffffffffffff600[0x46];
  x.payload._M_elems[0x3b] = in_stack_fffffffffffff600[0x47];
  x.payload._M_elems[0x3c] = in_stack_fffffffffffff600[0x48];
  x.payload._M_elems[0x3d] = in_stack_fffffffffffff600[0x49];
  x.payload._M_elems[0x3e] = in_stack_fffffffffffff600[0x4a];
  x.payload._M_elems[0x3f] = in_stack_fffffffffffff600[0x4b];
  x.payload._M_elems[0x40] = in_stack_fffffffffffff600[0x4c];
  x.payload._M_elems[0x41] = in_stack_fffffffffffff600[0x4d];
  x.payload._M_elems[0x42] = in_stack_fffffffffffff600[0x4e];
  x.payload._M_elems[0x43] = in_stack_fffffffffffff600[0x4f];
  x.payload._M_elems[0x44] = in_stack_fffffffffffff600[0x50];
  x.payload._M_elems[0x45] = in_stack_fffffffffffff600[0x51];
  x.payload._M_elems[0x46] = in_stack_fffffffffffff600[0x52];
  x.payload._M_elems[0x47] = in_stack_fffffffffffff600[0x53];
  x.payload._M_elems[0x48] = in_stack_fffffffffffff600[0x54];
  x.payload._M_elems[0x49] = in_stack_fffffffffffff600[0x55];
  x.payload._M_elems[0x4a] = in_stack_fffffffffffff600[0x56];
  x.payload._M_elems[0x4b] = in_stack_fffffffffffff600[0x57];
  x.payload._M_elems[0x4c] = in_stack_fffffffffffff600[0x58];
  x.payload._M_elems[0x4d] = in_stack_fffffffffffff600[0x59];
  x.payload._M_elems[0x4e] = in_stack_fffffffffffff600[0x5a];
  x.payload._M_elems[0x4f] = in_stack_fffffffffffff600[0x5b];
  x.payload._M_elems[0x50] = in_stack_fffffffffffff600[0x5c];
  x.payload._M_elems[0x51] = in_stack_fffffffffffff600[0x5d];
  x.payload._M_elems[0x52] = in_stack_fffffffffffff600[0x5e];
  x.payload._M_elems[0x53] = in_stack_fffffffffffff600[0x5f];
  x.payload._M_elems[0x54] = in_stack_fffffffffffff600[0x60];
  x.payload._M_elems[0x55] = in_stack_fffffffffffff600[0x61];
  x.payload._M_elems[0x56] = in_stack_fffffffffffff600[0x62];
  x.payload._M_elems[0x57] = in_stack_fffffffffffff600[99];
  x.payload._M_elems[0x58] = in_stack_fffffffffffff600[100];
  x.payload._M_elems[0x59] = in_stack_fffffffffffff600[0x65];
  x.payload._M_elems[0x5a] = in_stack_fffffffffffff600[0x66];
  x.payload._M_elems[0x5b] = in_stack_fffffffffffff600[0x67];
  x.payload._M_elems[0x5c] = in_stack_fffffffffffff600[0x68];
  x.payload._M_elems[0x5d] = in_stack_fffffffffffff600[0x69];
  x.payload._M_elems[0x5e] = in_stack_fffffffffffff600[0x6a];
  x.payload._M_elems[0x5f] = in_stack_fffffffffffff600[0x6b];
  x.payload._M_elems[0x60] = in_stack_fffffffffffff600[0x6c];
  x.payload._M_elems[0x61] = in_stack_fffffffffffff600[0x6d];
  x.payload._M_elems[0x62] = in_stack_fffffffffffff600[0x6e];
  x.payload._M_elems[99] = in_stack_fffffffffffff600[0x6f];
  x.payload._M_elems[100] = in_stack_fffffffffffff600[0x70];
  x.payload._M_elems[0x65] = in_stack_fffffffffffff600[0x71];
  x.payload._M_elems[0x66] = in_stack_fffffffffffff600[0x72];
  x.payload._M_elems[0x67] = in_stack_fffffffffffff600[0x73];
  x.payload._M_elems[0x68] = in_stack_fffffffffffff600[0x74];
  x.payload._M_elems[0x69] = in_stack_fffffffffffff600[0x75];
  x.payload._M_elems[0x6a] = in_stack_fffffffffffff600[0x76];
  x.payload._M_elems[0x6b] = in_stack_fffffffffffff600[0x77];
  x.payload._M_elems[0x6c] = in_stack_fffffffffffff600[0x78];
  x.payload._M_elems[0x6d] = in_stack_fffffffffffff600[0x79];
  x.payload._M_elems[0x6e] = in_stack_fffffffffffff600[0x7a];
  x.payload._M_elems[0x6f] = in_stack_fffffffffffff600[0x7b];
  x.payload._M_elems[0x70] = in_stack_fffffffffffff600[0x7c];
  x.payload._M_elems[0x71] = in_stack_fffffffffffff600[0x7d];
  x.payload._M_elems[0x72] = in_stack_fffffffffffff600[0x7e];
  x.payload._M_elems[0x73] = in_stack_fffffffffffff600[0x7f];
  x.payload._M_elems[0x74] = in_stack_fffffffffffff600[0x80];
  x.payload._M_elems[0x75] = in_stack_fffffffffffff600[0x81];
  x.payload._M_elems[0x76] = in_stack_fffffffffffff600[0x82];
  x.payload._M_elems[0x77] = in_stack_fffffffffffff600[0x83];
  x.payload._M_elems[0x78] = in_stack_fffffffffffff600[0x84];
  x.payload._M_elems[0x79] = in_stack_fffffffffffff600[0x85];
  x.payload._M_elems[0x7a] = in_stack_fffffffffffff600[0x86];
  x.payload._M_elems[0x7b] = in_stack_fffffffffffff600[0x87];
  x.payload._M_elems[0x7c] = in_stack_fffffffffffff600[0x88];
  x.payload._M_elems[0x7d] = in_stack_fffffffffffff600[0x89];
  x.payload._M_elems[0x7e] = in_stack_fffffffffffff600[0x8a];
  x.payload._M_elems[0x7f] = in_stack_fffffffffffff600[0x8b];
  x.payload._M_elems[0x80] = in_stack_fffffffffffff600[0x8c];
  x.payload._M_elems[0x81] = in_stack_fffffffffffff600[0x8d];
  x.payload._M_elems[0x82] = in_stack_fffffffffffff600[0x8e];
  x.payload._M_elems[0x83] = in_stack_fffffffffffff600[0x8f];
  x.payload._M_elems[0x84] = in_stack_fffffffffffff600[0x90];
  x.payload._M_elems[0x85] = in_stack_fffffffffffff600[0x91];
  x.payload._M_elems[0x86] = in_stack_fffffffffffff600[0x92];
  x.payload._M_elems[0x87] = in_stack_fffffffffffff600[0x93];
  x.payload._M_elems[0x88] = in_stack_fffffffffffff600[0x94];
  x.payload._M_elems[0x89] = in_stack_fffffffffffff600[0x95];
  x.payload._M_elems[0x8a] = in_stack_fffffffffffff600[0x96];
  x.payload._M_elems[0x8b] = in_stack_fffffffffffff600[0x97];
  x.payload._M_elems[0x8c] = in_stack_fffffffffffff600[0x98];
  x.payload._M_elems[0x8d] = in_stack_fffffffffffff600[0x99];
  x.payload._M_elems[0x8e] = in_stack_fffffffffffff600[0x9a];
  x.payload._M_elems[0x8f] = in_stack_fffffffffffff600[0x9b];
  x.payload._M_elems[0x90] = in_stack_fffffffffffff600[0x9c];
  x.payload._M_elems[0x91] = in_stack_fffffffffffff600[0x9d];
  x.payload._M_elems[0x92] = in_stack_fffffffffffff600[0x9e];
  x.payload._M_elems[0x93] = in_stack_fffffffffffff600[0x9f];
  x.payload._M_elems[0x94] = in_stack_fffffffffffff600[0xa0];
  x.payload._M_elems[0x95] = in_stack_fffffffffffff600[0xa1];
  x.payload._M_elems[0x96] = in_stack_fffffffffffff600[0xa2];
  x.payload._M_elems[0x97] = in_stack_fffffffffffff600[0xa3];
  x.payload._M_elems[0x98] = in_stack_fffffffffffff600[0xa4];
  x.payload._M_elems[0x99] = in_stack_fffffffffffff600[0xa5];
  x.payload._M_elems[0x9a] = in_stack_fffffffffffff600[0xa6];
  x.payload._M_elems[0x9b] = in_stack_fffffffffffff600[0xa7];
  x.payload._M_elems[0x9c] = in_stack_fffffffffffff600[0xa8];
  x.payload._M_elems[0x9d] = in_stack_fffffffffffff600[0xa9];
  x.payload._M_elems[0x9e] = in_stack_fffffffffffff600[0xaa];
  x.payload._M_elems[0x9f] = in_stack_fffffffffffff600[0xab];
  x.payload._M_elems[0xa0] = in_stack_fffffffffffff600[0xac];
  x.payload._M_elems[0xa1] = in_stack_fffffffffffff600[0xad];
  x.payload._M_elems[0xa2] = in_stack_fffffffffffff600[0xae];
  x.payload._M_elems[0xa3] = in_stack_fffffffffffff600[0xaf];
  x.payload._M_elems[0xa4] = in_stack_fffffffffffff600[0xb0];
  x.payload._M_elems[0xa5] = in_stack_fffffffffffff600[0xb1];
  x.payload._M_elems[0xa6] = in_stack_fffffffffffff600[0xb2];
  x.payload._M_elems[0xa7] = in_stack_fffffffffffff600[0xb3];
  x.payload._M_elems[0xa8] = in_stack_fffffffffffff600[0xb4];
  x.payload._M_elems[0xa9] = in_stack_fffffffffffff600[0xb5];
  x.payload._M_elems[0xaa] = in_stack_fffffffffffff600[0xb6];
  x.payload._M_elems[0xab] = in_stack_fffffffffffff600[0xb7];
  x.payload._M_elems[0xac] = in_stack_fffffffffffff600[0xb8];
  x.payload._M_elems[0xad] = in_stack_fffffffffffff600[0xb9];
  x.payload._M_elems[0xae] = in_stack_fffffffffffff600[0xba];
  x.payload._M_elems[0xaf] = in_stack_fffffffffffff600[0xbb];
  x.payload._M_elems[0xb0] = in_stack_fffffffffffff600[0xbc];
  x.payload._M_elems[0xb1] = in_stack_fffffffffffff600[0xbd];
  x.payload._M_elems[0xb2] = in_stack_fffffffffffff600[0xbe];
  x.payload._M_elems[0xb3] = in_stack_fffffffffffff600[0xbf];
  x.payload._M_elems[0xb4] = in_stack_fffffffffffff600[0xc0];
  x.payload._M_elems[0xb5] = in_stack_fffffffffffff600[0xc1];
  x.payload._M_elems[0xb6] = in_stack_fffffffffffff600[0xc2];
  x.payload._M_elems[0xb7] = in_stack_fffffffffffff600[0xc3];
  x.payload._M_elems[0xb8] = in_stack_fffffffffffff600[0xc4];
  x.payload._M_elems[0xb9] = in_stack_fffffffffffff600[0xc5];
  x.payload._M_elems[0xba] = in_stack_fffffffffffff600[0xc6];
  x.payload._M_elems[0xbb] = in_stack_fffffffffffff600[199];
  x.payload._M_elems[0xbc] = in_stack_fffffffffffff600[200];
  x.payload._M_elems[0xbd] = in_stack_fffffffffffff600[0xc9];
  x.payload._M_elems[0xbe] = in_stack_fffffffffffff600[0xca];
  x.payload._M_elems[0xbf] = in_stack_fffffffffffff600[0xcb];
  x.payload._M_elems[0xc0] = in_stack_fffffffffffff600[0xcc];
  x.payload._M_elems[0xc1] = in_stack_fffffffffffff600[0xcd];
  x.payload._M_elems[0xc2] = in_stack_fffffffffffff600[0xce];
  x.payload._M_elems[0xc3] = in_stack_fffffffffffff600[0xcf];
  x.payload._M_elems[0xc4] = in_stack_fffffffffffff600[0xd0];
  x.payload._M_elems[0xc5] = in_stack_fffffffffffff600[0xd1];
  x.payload._M_elems[0xc6] = in_stack_fffffffffffff600[0xd2];
  x.payload._M_elems[199] = in_stack_fffffffffffff600[0xd3];
  x.payload._M_elems[200] = in_stack_fffffffffffff600[0xd4];
  x.payload._M_elems[0xc9] = in_stack_fffffffffffff600[0xd5];
  x.payload._M_elems[0xca] = in_stack_fffffffffffff600[0xd6];
  x.payload._M_elems[0xcb] = in_stack_fffffffffffff600[0xd7];
  x.payload._M_elems[0xcc] = in_stack_fffffffffffff600[0xd8];
  x.payload._M_elems[0xcd] = in_stack_fffffffffffff600[0xd9];
  x.payload._M_elems[0xce] = in_stack_fffffffffffff600[0xda];
  x.payload._M_elems[0xcf] = in_stack_fffffffffffff600[0xdb];
  x.payload._M_elems[0xd0] = in_stack_fffffffffffff600[0xdc];
  x.payload._M_elems[0xd1] = in_stack_fffffffffffff600[0xdd];
  x.payload._M_elems[0xd2] = in_stack_fffffffffffff600[0xde];
  x.payload._M_elems[0xd3] = in_stack_fffffffffffff600[0xdf];
  x.payload._M_elems[0xd4] = in_stack_fffffffffffff600[0xe0];
  x.payload._M_elems[0xd5] = in_stack_fffffffffffff600[0xe1];
  x.payload._M_elems[0xd6] = in_stack_fffffffffffff600[0xe2];
  x.payload._M_elems[0xd7] = in_stack_fffffffffffff600[0xe3];
  x.payload._M_elems[0xd8] = in_stack_fffffffffffff600[0xe4];
  x.payload._M_elems[0xd9] = in_stack_fffffffffffff600[0xe5];
  x.payload._M_elems[0xda] = in_stack_fffffffffffff600[0xe6];
  x.payload._M_elems[0xdb] = in_stack_fffffffffffff600[0xe7];
  x.payload._M_elems[0xdc] = in_stack_fffffffffffff600[0xe8];
  x.payload._M_elems[0xdd] = in_stack_fffffffffffff600[0xe9];
  x.payload._M_elems[0xde] = in_stack_fffffffffffff600[0xea];
  x.payload._M_elems[0xdf] = in_stack_fffffffffffff600[0xeb];
  x.payload._M_elems[0xe0] = in_stack_fffffffffffff600[0xec];
  x.payload._M_elems[0xe1] = in_stack_fffffffffffff600[0xed];
  x.payload._M_elems[0xe2] = in_stack_fffffffffffff600[0xee];
  x.payload._M_elems[0xe3] = in_stack_fffffffffffff600[0xef];
  x.payload._M_elems[0xe4] = in_stack_fffffffffffff600[0xf0];
  x.payload._M_elems[0xe5] = in_stack_fffffffffffff600[0xf1];
  x.payload._M_elems[0xe6] = in_stack_fffffffffffff600[0xf2];
  x.payload._M_elems[0xe7] = in_stack_fffffffffffff600[0xf3];
  x.payload._M_elems[0xe8] = in_stack_fffffffffffff600[0xf4];
  x.payload._M_elems[0xe9] = in_stack_fffffffffffff600[0xf5];
  x.payload._M_elems[0xea] = in_stack_fffffffffffff600[0xf6];
  x.payload._M_elems[0xeb] = in_stack_fffffffffffff600[0xf7];
  testing::Eq<pstore::brokerface::message_type>(x);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_3d8,&local_4d8);
  anon_unknown.dwarf_382ab::mock_writer::gmock_write_impl
            (&local_3c0,(mock_writer *)(expected1.payload._M_elems + 0xec),&local_3d8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::operator()
                     (&local_3c0,&local_5d9,(void *)0x0);
  pTVar6 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x51,"wr","write_impl (Eq (expected1))");
  testing::Return<bool>((testing *)&local_610,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_600,(ReturnAction *)&local_610);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar6,&local_600);
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::~Action(&local_600);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_610);
  testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::~MockSpec
            (&local_3c0);
  testing::Matcher<const_pstore::brokerface::message_type_&>::~Matcher(&local_3d8);
  memcpy(local_848,local_374,0x100);
  puVar7 = local_848;
  puVar8 = &uStackY_a08;
  for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  x_00.payload._M_elems[0xec] = (char)in_stack_fffffffffffff6f8;
  x_00.payload._M_elems[0xed] = (char)((ulong)in_stack_fffffffffffff6f8 >> 8);
  x_00.payload._M_elems[0xee] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x10);
  x_00.payload._M_elems[0xef] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x18);
  x_00.payload._M_elems[0xf0] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  x_00.payload._M_elems[0xf1] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x28);
  x_00.payload._M_elems[0xf2] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x30);
  x_00.payload._M_elems[0xf3] = (char)((ulong)in_stack_fffffffffffff6f8 >> 0x38);
  x_00.sender_id = in_stack_fffffffffffff600._0_4_;
  x_00.message_id = in_stack_fffffffffffff600._4_4_;
  x_00.part_no = in_stack_fffffffffffff600._8_2_;
  x_00.num_parts = in_stack_fffffffffffff600._10_2_;
  x_00.payload._M_elems[0] = in_stack_fffffffffffff600[0xc];
  x_00.payload._M_elems[1] = in_stack_fffffffffffff600[0xd];
  x_00.payload._M_elems[2] = in_stack_fffffffffffff600[0xe];
  x_00.payload._M_elems[3] = in_stack_fffffffffffff600[0xf];
  x_00.payload._M_elems[4] = in_stack_fffffffffffff600[0x10];
  x_00.payload._M_elems[5] = in_stack_fffffffffffff600[0x11];
  x_00.payload._M_elems[6] = in_stack_fffffffffffff600[0x12];
  x_00.payload._M_elems[7] = in_stack_fffffffffffff600[0x13];
  x_00.payload._M_elems[8] = in_stack_fffffffffffff600[0x14];
  x_00.payload._M_elems[9] = in_stack_fffffffffffff600[0x15];
  x_00.payload._M_elems[10] = in_stack_fffffffffffff600[0x16];
  x_00.payload._M_elems[0xb] = in_stack_fffffffffffff600[0x17];
  x_00.payload._M_elems[0xc] = in_stack_fffffffffffff600[0x18];
  x_00.payload._M_elems[0xd] = in_stack_fffffffffffff600[0x19];
  x_00.payload._M_elems[0xe] = in_stack_fffffffffffff600[0x1a];
  x_00.payload._M_elems[0xf] = in_stack_fffffffffffff600[0x1b];
  x_00.payload._M_elems[0x10] = in_stack_fffffffffffff600[0x1c];
  x_00.payload._M_elems[0x11] = in_stack_fffffffffffff600[0x1d];
  x_00.payload._M_elems[0x12] = in_stack_fffffffffffff600[0x1e];
  x_00.payload._M_elems[0x13] = in_stack_fffffffffffff600[0x1f];
  x_00.payload._M_elems[0x14] = in_stack_fffffffffffff600[0x20];
  x_00.payload._M_elems[0x15] = in_stack_fffffffffffff600[0x21];
  x_00.payload._M_elems[0x16] = in_stack_fffffffffffff600[0x22];
  x_00.payload._M_elems[0x17] = in_stack_fffffffffffff600[0x23];
  x_00.payload._M_elems[0x18] = in_stack_fffffffffffff600[0x24];
  x_00.payload._M_elems[0x19] = in_stack_fffffffffffff600[0x25];
  x_00.payload._M_elems[0x1a] = in_stack_fffffffffffff600[0x26];
  x_00.payload._M_elems[0x1b] = in_stack_fffffffffffff600[0x27];
  x_00.payload._M_elems[0x1c] = in_stack_fffffffffffff600[0x28];
  x_00.payload._M_elems[0x1d] = in_stack_fffffffffffff600[0x29];
  x_00.payload._M_elems[0x1e] = in_stack_fffffffffffff600[0x2a];
  x_00.payload._M_elems[0x1f] = in_stack_fffffffffffff600[0x2b];
  x_00.payload._M_elems[0x20] = in_stack_fffffffffffff600[0x2c];
  x_00.payload._M_elems[0x21] = in_stack_fffffffffffff600[0x2d];
  x_00.payload._M_elems[0x22] = in_stack_fffffffffffff600[0x2e];
  x_00.payload._M_elems[0x23] = in_stack_fffffffffffff600[0x2f];
  x_00.payload._M_elems[0x24] = in_stack_fffffffffffff600[0x30];
  x_00.payload._M_elems[0x25] = in_stack_fffffffffffff600[0x31];
  x_00.payload._M_elems[0x26] = in_stack_fffffffffffff600[0x32];
  x_00.payload._M_elems[0x27] = in_stack_fffffffffffff600[0x33];
  x_00.payload._M_elems[0x28] = in_stack_fffffffffffff600[0x34];
  x_00.payload._M_elems[0x29] = in_stack_fffffffffffff600[0x35];
  x_00.payload._M_elems[0x2a] = in_stack_fffffffffffff600[0x36];
  x_00.payload._M_elems[0x2b] = in_stack_fffffffffffff600[0x37];
  x_00.payload._M_elems[0x2c] = in_stack_fffffffffffff600[0x38];
  x_00.payload._M_elems[0x2d] = in_stack_fffffffffffff600[0x39];
  x_00.payload._M_elems[0x2e] = in_stack_fffffffffffff600[0x3a];
  x_00.payload._M_elems[0x2f] = in_stack_fffffffffffff600[0x3b];
  x_00.payload._M_elems[0x30] = in_stack_fffffffffffff600[0x3c];
  x_00.payload._M_elems[0x31] = in_stack_fffffffffffff600[0x3d];
  x_00.payload._M_elems[0x32] = in_stack_fffffffffffff600[0x3e];
  x_00.payload._M_elems[0x33] = in_stack_fffffffffffff600[0x3f];
  x_00.payload._M_elems[0x34] = in_stack_fffffffffffff600[0x40];
  x_00.payload._M_elems[0x35] = in_stack_fffffffffffff600[0x41];
  x_00.payload._M_elems[0x36] = in_stack_fffffffffffff600[0x42];
  x_00.payload._M_elems[0x37] = in_stack_fffffffffffff600[0x43];
  x_00.payload._M_elems[0x38] = in_stack_fffffffffffff600[0x44];
  x_00.payload._M_elems[0x39] = in_stack_fffffffffffff600[0x45];
  x_00.payload._M_elems[0x3a] = in_stack_fffffffffffff600[0x46];
  x_00.payload._M_elems[0x3b] = in_stack_fffffffffffff600[0x47];
  x_00.payload._M_elems[0x3c] = in_stack_fffffffffffff600[0x48];
  x_00.payload._M_elems[0x3d] = in_stack_fffffffffffff600[0x49];
  x_00.payload._M_elems[0x3e] = in_stack_fffffffffffff600[0x4a];
  x_00.payload._M_elems[0x3f] = in_stack_fffffffffffff600[0x4b];
  x_00.payload._M_elems[0x40] = in_stack_fffffffffffff600[0x4c];
  x_00.payload._M_elems[0x41] = in_stack_fffffffffffff600[0x4d];
  x_00.payload._M_elems[0x42] = in_stack_fffffffffffff600[0x4e];
  x_00.payload._M_elems[0x43] = in_stack_fffffffffffff600[0x4f];
  x_00.payload._M_elems[0x44] = in_stack_fffffffffffff600[0x50];
  x_00.payload._M_elems[0x45] = in_stack_fffffffffffff600[0x51];
  x_00.payload._M_elems[0x46] = in_stack_fffffffffffff600[0x52];
  x_00.payload._M_elems[0x47] = in_stack_fffffffffffff600[0x53];
  x_00.payload._M_elems[0x48] = in_stack_fffffffffffff600[0x54];
  x_00.payload._M_elems[0x49] = in_stack_fffffffffffff600[0x55];
  x_00.payload._M_elems[0x4a] = in_stack_fffffffffffff600[0x56];
  x_00.payload._M_elems[0x4b] = in_stack_fffffffffffff600[0x57];
  x_00.payload._M_elems[0x4c] = in_stack_fffffffffffff600[0x58];
  x_00.payload._M_elems[0x4d] = in_stack_fffffffffffff600[0x59];
  x_00.payload._M_elems[0x4e] = in_stack_fffffffffffff600[0x5a];
  x_00.payload._M_elems[0x4f] = in_stack_fffffffffffff600[0x5b];
  x_00.payload._M_elems[0x50] = in_stack_fffffffffffff600[0x5c];
  x_00.payload._M_elems[0x51] = in_stack_fffffffffffff600[0x5d];
  x_00.payload._M_elems[0x52] = in_stack_fffffffffffff600[0x5e];
  x_00.payload._M_elems[0x53] = in_stack_fffffffffffff600[0x5f];
  x_00.payload._M_elems[0x54] = in_stack_fffffffffffff600[0x60];
  x_00.payload._M_elems[0x55] = in_stack_fffffffffffff600[0x61];
  x_00.payload._M_elems[0x56] = in_stack_fffffffffffff600[0x62];
  x_00.payload._M_elems[0x57] = in_stack_fffffffffffff600[99];
  x_00.payload._M_elems[0x58] = in_stack_fffffffffffff600[100];
  x_00.payload._M_elems[0x59] = in_stack_fffffffffffff600[0x65];
  x_00.payload._M_elems[0x5a] = in_stack_fffffffffffff600[0x66];
  x_00.payload._M_elems[0x5b] = in_stack_fffffffffffff600[0x67];
  x_00.payload._M_elems[0x5c] = in_stack_fffffffffffff600[0x68];
  x_00.payload._M_elems[0x5d] = in_stack_fffffffffffff600[0x69];
  x_00.payload._M_elems[0x5e] = in_stack_fffffffffffff600[0x6a];
  x_00.payload._M_elems[0x5f] = in_stack_fffffffffffff600[0x6b];
  x_00.payload._M_elems[0x60] = in_stack_fffffffffffff600[0x6c];
  x_00.payload._M_elems[0x61] = in_stack_fffffffffffff600[0x6d];
  x_00.payload._M_elems[0x62] = in_stack_fffffffffffff600[0x6e];
  x_00.payload._M_elems[99] = in_stack_fffffffffffff600[0x6f];
  x_00.payload._M_elems[100] = in_stack_fffffffffffff600[0x70];
  x_00.payload._M_elems[0x65] = in_stack_fffffffffffff600[0x71];
  x_00.payload._M_elems[0x66] = in_stack_fffffffffffff600[0x72];
  x_00.payload._M_elems[0x67] = in_stack_fffffffffffff600[0x73];
  x_00.payload._M_elems[0x68] = in_stack_fffffffffffff600[0x74];
  x_00.payload._M_elems[0x69] = in_stack_fffffffffffff600[0x75];
  x_00.payload._M_elems[0x6a] = in_stack_fffffffffffff600[0x76];
  x_00.payload._M_elems[0x6b] = in_stack_fffffffffffff600[0x77];
  x_00.payload._M_elems[0x6c] = in_stack_fffffffffffff600[0x78];
  x_00.payload._M_elems[0x6d] = in_stack_fffffffffffff600[0x79];
  x_00.payload._M_elems[0x6e] = in_stack_fffffffffffff600[0x7a];
  x_00.payload._M_elems[0x6f] = in_stack_fffffffffffff600[0x7b];
  x_00.payload._M_elems[0x70] = in_stack_fffffffffffff600[0x7c];
  x_00.payload._M_elems[0x71] = in_stack_fffffffffffff600[0x7d];
  x_00.payload._M_elems[0x72] = in_stack_fffffffffffff600[0x7e];
  x_00.payload._M_elems[0x73] = in_stack_fffffffffffff600[0x7f];
  x_00.payload._M_elems[0x74] = in_stack_fffffffffffff600[0x80];
  x_00.payload._M_elems[0x75] = in_stack_fffffffffffff600[0x81];
  x_00.payload._M_elems[0x76] = in_stack_fffffffffffff600[0x82];
  x_00.payload._M_elems[0x77] = in_stack_fffffffffffff600[0x83];
  x_00.payload._M_elems[0x78] = in_stack_fffffffffffff600[0x84];
  x_00.payload._M_elems[0x79] = in_stack_fffffffffffff600[0x85];
  x_00.payload._M_elems[0x7a] = in_stack_fffffffffffff600[0x86];
  x_00.payload._M_elems[0x7b] = in_stack_fffffffffffff600[0x87];
  x_00.payload._M_elems[0x7c] = in_stack_fffffffffffff600[0x88];
  x_00.payload._M_elems[0x7d] = in_stack_fffffffffffff600[0x89];
  x_00.payload._M_elems[0x7e] = in_stack_fffffffffffff600[0x8a];
  x_00.payload._M_elems[0x7f] = in_stack_fffffffffffff600[0x8b];
  x_00.payload._M_elems[0x80] = in_stack_fffffffffffff600[0x8c];
  x_00.payload._M_elems[0x81] = in_stack_fffffffffffff600[0x8d];
  x_00.payload._M_elems[0x82] = in_stack_fffffffffffff600[0x8e];
  x_00.payload._M_elems[0x83] = in_stack_fffffffffffff600[0x8f];
  x_00.payload._M_elems[0x84] = in_stack_fffffffffffff600[0x90];
  x_00.payload._M_elems[0x85] = in_stack_fffffffffffff600[0x91];
  x_00.payload._M_elems[0x86] = in_stack_fffffffffffff600[0x92];
  x_00.payload._M_elems[0x87] = in_stack_fffffffffffff600[0x93];
  x_00.payload._M_elems[0x88] = in_stack_fffffffffffff600[0x94];
  x_00.payload._M_elems[0x89] = in_stack_fffffffffffff600[0x95];
  x_00.payload._M_elems[0x8a] = in_stack_fffffffffffff600[0x96];
  x_00.payload._M_elems[0x8b] = in_stack_fffffffffffff600[0x97];
  x_00.payload._M_elems[0x8c] = in_stack_fffffffffffff600[0x98];
  x_00.payload._M_elems[0x8d] = in_stack_fffffffffffff600[0x99];
  x_00.payload._M_elems[0x8e] = in_stack_fffffffffffff600[0x9a];
  x_00.payload._M_elems[0x8f] = in_stack_fffffffffffff600[0x9b];
  x_00.payload._M_elems[0x90] = in_stack_fffffffffffff600[0x9c];
  x_00.payload._M_elems[0x91] = in_stack_fffffffffffff600[0x9d];
  x_00.payload._M_elems[0x92] = in_stack_fffffffffffff600[0x9e];
  x_00.payload._M_elems[0x93] = in_stack_fffffffffffff600[0x9f];
  x_00.payload._M_elems[0x94] = in_stack_fffffffffffff600[0xa0];
  x_00.payload._M_elems[0x95] = in_stack_fffffffffffff600[0xa1];
  x_00.payload._M_elems[0x96] = in_stack_fffffffffffff600[0xa2];
  x_00.payload._M_elems[0x97] = in_stack_fffffffffffff600[0xa3];
  x_00.payload._M_elems[0x98] = in_stack_fffffffffffff600[0xa4];
  x_00.payload._M_elems[0x99] = in_stack_fffffffffffff600[0xa5];
  x_00.payload._M_elems[0x9a] = in_stack_fffffffffffff600[0xa6];
  x_00.payload._M_elems[0x9b] = in_stack_fffffffffffff600[0xa7];
  x_00.payload._M_elems[0x9c] = in_stack_fffffffffffff600[0xa8];
  x_00.payload._M_elems[0x9d] = in_stack_fffffffffffff600[0xa9];
  x_00.payload._M_elems[0x9e] = in_stack_fffffffffffff600[0xaa];
  x_00.payload._M_elems[0x9f] = in_stack_fffffffffffff600[0xab];
  x_00.payload._M_elems[0xa0] = in_stack_fffffffffffff600[0xac];
  x_00.payload._M_elems[0xa1] = in_stack_fffffffffffff600[0xad];
  x_00.payload._M_elems[0xa2] = in_stack_fffffffffffff600[0xae];
  x_00.payload._M_elems[0xa3] = in_stack_fffffffffffff600[0xaf];
  x_00.payload._M_elems[0xa4] = in_stack_fffffffffffff600[0xb0];
  x_00.payload._M_elems[0xa5] = in_stack_fffffffffffff600[0xb1];
  x_00.payload._M_elems[0xa6] = in_stack_fffffffffffff600[0xb2];
  x_00.payload._M_elems[0xa7] = in_stack_fffffffffffff600[0xb3];
  x_00.payload._M_elems[0xa8] = in_stack_fffffffffffff600[0xb4];
  x_00.payload._M_elems[0xa9] = in_stack_fffffffffffff600[0xb5];
  x_00.payload._M_elems[0xaa] = in_stack_fffffffffffff600[0xb6];
  x_00.payload._M_elems[0xab] = in_stack_fffffffffffff600[0xb7];
  x_00.payload._M_elems[0xac] = in_stack_fffffffffffff600[0xb8];
  x_00.payload._M_elems[0xad] = in_stack_fffffffffffff600[0xb9];
  x_00.payload._M_elems[0xae] = in_stack_fffffffffffff600[0xba];
  x_00.payload._M_elems[0xaf] = in_stack_fffffffffffff600[0xbb];
  x_00.payload._M_elems[0xb0] = in_stack_fffffffffffff600[0xbc];
  x_00.payload._M_elems[0xb1] = in_stack_fffffffffffff600[0xbd];
  x_00.payload._M_elems[0xb2] = in_stack_fffffffffffff600[0xbe];
  x_00.payload._M_elems[0xb3] = in_stack_fffffffffffff600[0xbf];
  x_00.payload._M_elems[0xb4] = in_stack_fffffffffffff600[0xc0];
  x_00.payload._M_elems[0xb5] = in_stack_fffffffffffff600[0xc1];
  x_00.payload._M_elems[0xb6] = in_stack_fffffffffffff600[0xc2];
  x_00.payload._M_elems[0xb7] = in_stack_fffffffffffff600[0xc3];
  x_00.payload._M_elems[0xb8] = in_stack_fffffffffffff600[0xc4];
  x_00.payload._M_elems[0xb9] = in_stack_fffffffffffff600[0xc5];
  x_00.payload._M_elems[0xba] = in_stack_fffffffffffff600[0xc6];
  x_00.payload._M_elems[0xbb] = in_stack_fffffffffffff600[199];
  x_00.payload._M_elems[0xbc] = in_stack_fffffffffffff600[200];
  x_00.payload._M_elems[0xbd] = in_stack_fffffffffffff600[0xc9];
  x_00.payload._M_elems[0xbe] = in_stack_fffffffffffff600[0xca];
  x_00.payload._M_elems[0xbf] = in_stack_fffffffffffff600[0xcb];
  x_00.payload._M_elems[0xc0] = in_stack_fffffffffffff600[0xcc];
  x_00.payload._M_elems[0xc1] = in_stack_fffffffffffff600[0xcd];
  x_00.payload._M_elems[0xc2] = in_stack_fffffffffffff600[0xce];
  x_00.payload._M_elems[0xc3] = in_stack_fffffffffffff600[0xcf];
  x_00.payload._M_elems[0xc4] = in_stack_fffffffffffff600[0xd0];
  x_00.payload._M_elems[0xc5] = in_stack_fffffffffffff600[0xd1];
  x_00.payload._M_elems[0xc6] = in_stack_fffffffffffff600[0xd2];
  x_00.payload._M_elems[199] = in_stack_fffffffffffff600[0xd3];
  x_00.payload._M_elems[200] = in_stack_fffffffffffff600[0xd4];
  x_00.payload._M_elems[0xc9] = in_stack_fffffffffffff600[0xd5];
  x_00.payload._M_elems[0xca] = in_stack_fffffffffffff600[0xd6];
  x_00.payload._M_elems[0xcb] = in_stack_fffffffffffff600[0xd7];
  x_00.payload._M_elems[0xcc] = in_stack_fffffffffffff600[0xd8];
  x_00.payload._M_elems[0xcd] = in_stack_fffffffffffff600[0xd9];
  x_00.payload._M_elems[0xce] = in_stack_fffffffffffff600[0xda];
  x_00.payload._M_elems[0xcf] = in_stack_fffffffffffff600[0xdb];
  x_00.payload._M_elems[0xd0] = in_stack_fffffffffffff600[0xdc];
  x_00.payload._M_elems[0xd1] = in_stack_fffffffffffff600[0xdd];
  x_00.payload._M_elems[0xd2] = in_stack_fffffffffffff600[0xde];
  x_00.payload._M_elems[0xd3] = in_stack_fffffffffffff600[0xdf];
  x_00.payload._M_elems[0xd4] = in_stack_fffffffffffff600[0xe0];
  x_00.payload._M_elems[0xd5] = in_stack_fffffffffffff600[0xe1];
  x_00.payload._M_elems[0xd6] = in_stack_fffffffffffff600[0xe2];
  x_00.payload._M_elems[0xd7] = in_stack_fffffffffffff600[0xe3];
  x_00.payload._M_elems[0xd8] = in_stack_fffffffffffff600[0xe4];
  x_00.payload._M_elems[0xd9] = in_stack_fffffffffffff600[0xe5];
  x_00.payload._M_elems[0xda] = in_stack_fffffffffffff600[0xe6];
  x_00.payload._M_elems[0xdb] = in_stack_fffffffffffff600[0xe7];
  x_00.payload._M_elems[0xdc] = in_stack_fffffffffffff600[0xe8];
  x_00.payload._M_elems[0xdd] = in_stack_fffffffffffff600[0xe9];
  x_00.payload._M_elems[0xde] = in_stack_fffffffffffff600[0xea];
  x_00.payload._M_elems[0xdf] = in_stack_fffffffffffff600[0xeb];
  x_00.payload._M_elems[0xe0] = in_stack_fffffffffffff600[0xec];
  x_00.payload._M_elems[0xe1] = in_stack_fffffffffffff600[0xed];
  x_00.payload._M_elems[0xe2] = in_stack_fffffffffffff600[0xee];
  x_00.payload._M_elems[0xe3] = in_stack_fffffffffffff600[0xef];
  x_00.payload._M_elems[0xe4] = in_stack_fffffffffffff600[0xf0];
  x_00.payload._M_elems[0xe5] = in_stack_fffffffffffff600[0xf1];
  x_00.payload._M_elems[0xe6] = in_stack_fffffffffffff600[0xf2];
  x_00.payload._M_elems[0xe7] = in_stack_fffffffffffff600[0xf3];
  x_00.payload._M_elems[0xe8] = in_stack_fffffffffffff600[0xf4];
  x_00.payload._M_elems[0xe9] = in_stack_fffffffffffff600[0xf5];
  x_00.payload._M_elems[0xea] = in_stack_fffffffffffff600[0xf6];
  x_00.payload._M_elems[0xeb] = in_stack_fffffffffffff600[0xf7];
  testing::Eq<pstore::brokerface::message_type>(x_00);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_648,&local_748);
  anon_unknown.dwarf_382ab::mock_writer::gmock_write_impl
            (&local_630,(mock_writer *)(expected1.payload._M_elems + 0xec),&local_648);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::operator()
                     (&local_630,&local_849,(void *)0x0);
  pTVar6 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x52,"wr","write_impl (Eq (expected2))");
  testing::Return<bool>((testing *)&local_880,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_870,(ReturnAction *)&local_880);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar6,&local_870);
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::~Action(&local_870);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_880);
  testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::~MockSpec
            (&local_630);
  testing::Matcher<const_pstore::brokerface::message_type_&>::~Matcher(&local_648);
  verb_00 = (czstring)std::__cxx11::string::c_str();
  path_00 = (czstring)std::__cxx11::string::c_str();
  pstore::brokerface::send_message
            ((writer *)(expected1.payload._M_elems + 0xec),true,verb_00,path_00);
  anon_unknown.dwarf_382ab::mock_writer::~mock_writer
            ((mock_writer *)(expected1.payload._M_elems + 0xec));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (BrokerSendMessage, TwoParts) {
    using ::testing::Eq;
    using ::testing::Return;

    std::string const verb = "verb";
    auto const part1_chars = pstore::brokerface::message_type::payload_chars - verb.length () - 1U;

    // Increase the length by 1 to cause the payload to overflow into a second message.
    std::string::size_type const payload_length = part1_chars + 1U;
    std::string const path (payload_length, 'p');

    auto const part2_chars = payload_length - part1_chars;

    mock_writer wr;

    pstore::brokerface::message_type const expected1 (message_id_, 0, 2,
                                                      verb + ' ' + std::string (part1_chars, 'p'));
    pstore::brokerface::message_type const expected2 (message_id_, 1, 2,
                                                      std::string (part2_chars, 'p'));
    EXPECT_CALL (wr, write_impl (Eq (expected1))).WillOnce (Return (true));
    EXPECT_CALL (wr, write_impl (Eq (expected2))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, verb.c_str (), path.c_str ());
}